

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  LodePNGEncoderSettings *settings;
  LodePNGColorMode *mode_in;
  LodePNGColorMode *mode_in_00;
  LodePNGColorType LVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char *a;
  char *a_00;
  uchar *chunk;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t size;
  size_t size_00;
  size_t sVar11;
  uint uVar12;
  uchar *puVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  uint local_714;
  ucvector v;
  uchar *data;
  LodePNGColorMode auto_color;
  size_t datasize;
  uint r;
  uchar image_1 [8];
  uchar *compressed;
  uchar *local_678;
  size_t sStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  LodePNGInfo info;
  LodePNGColorMode result;
  uint b;
  uint g;
  LodePNGColorStats stats;
  
  data = (uchar *)0x0;
  datasize = 0;
  v.data = (uchar *)0x0;
  v.size = 0;
  v.allocsize = 0;
  lodepng_info_init(&info);
  auto_color.key_defined = 0;
  auto_color.key_r = 0;
  auto_color.key_g = 0;
  auto_color.key_b = 0;
  auto_color.colortype = LCT_RGBA;
  auto_color.bitdepth = 8;
  auto_color.palette = (uchar *)0x0;
  auto_color.palettesize = 0;
  *out = (uchar *)0x0;
  *outsize = 0;
  state->error = 0;
  LVar1 = (state->info_png).color.colortype;
  if (((LVar1 == LCT_PALETTE) || ((state->encoder).force_palette != 0)) &&
     ((state->info_png).color.palettesize - 0x101 < 0xffffffffffffff00)) {
    state->error = 0x44;
    goto LAB_001ba564;
  }
  if (2 < (state->encoder).zlibsettings.btype) {
    state->error = 0x3d;
    goto LAB_001ba564;
  }
  if (1 < (state->info_png).interlace_method) {
    state->error = 0x47;
    goto LAB_001ba564;
  }
  uVar5 = checkColorValidity(LVar1,(state->info_png).color.bitdepth);
  state->error = uVar5;
  if (uVar5 != 0) goto LAB_001ba564;
  uVar5 = checkColorValidity((state->info_raw).colortype,(state->info_raw).bitdepth);
  state->error = uVar5;
  if (uVar5 != 0) goto LAB_001ba564;
  mode_in = &state->info_raw;
  lodepng_info_copy(&info,&state->info_png);
  local_714 = 8;
  if ((state->encoder).auto_convert != 0) {
    stats.alpha = 0;
    stats.numcolors = 0;
    stats.colored = 0;
    stats.key._0_2_ = 0;
    stats.key._2_2_ = 0;
    stats.key_r = 0;
    stats.key_g = 0;
    stats.key_b = 0;
    stats.bits = 1;
    stats.numpixels = 0;
    stats.allow_palette = 1;
    stats.allow_greyscale = 1;
    if ((state->info_png).iccp_defined != 0) {
      puVar13 = (state->info_png).iccp_profile;
      uVar5 = (state->info_png).iccp_profile_size;
      uVar6 = isGrayICCProfile(puVar13,uVar5);
      if (uVar6 != 0) {
        stats._1064_8_ = stats._1064_8_ & 0xffffffff00000000;
      }
      uVar5 = isRGBICCProfile(puVar13,uVar5);
      if (uVar5 != 0) {
        stats._1064_8_ = stats._1064_8_ & 0xffffffff;
      }
    }
    uVar5 = lodepng_compute_color_stats(&stats,image,w,h,mode_in);
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_001ba564;
    mode_in_00 = &(state->info_png).color;
    if ((state->info_png).background_defined != 0) {
      r = 0;
      g = 0;
      b = 0;
      result.key_defined = 0;
      result.key_r = 0;
      result.key_g = 0;
      result.key_b = 0;
      result.palette = (uchar *)0x0;
      result.palettesize = 0;
      result.colortype = LCT_RGB;
      result.bitdepth = 0x10;
      lodepng_convert_rgb(&r,&g,&b,(state->info_png).background_r,(state->info_png).background_g,
                          (state->info_png).background_b,&result,mode_in_00);
      image_1[0] = (uchar)(r >> 8);
      image_1[1] = (uchar)r;
      image_1[2] = (uchar)(g >> 8);
      image_1[3] = (uchar)g;
      image_1[4] = (uchar)(b >> 8);
      image_1[5] = (uchar)b;
      image_1[6] = 0xff;
      image_1[7] = 0xff;
      local_668._0_4_ = 0;
      local_668._4_4_ = 0;
      uStack_660._0_4_ = 0;
      uStack_660._4_4_ = 0;
      local_678 = (uchar *)0x0;
      sStack_670 = 0;
      compressed = (uchar *)0x1000000006;
      uVar5 = lodepng_compute_color_stats(&stats,image_1,1,1,(LodePNGColorMode *)&compressed);
      lodepng_palette_clear((LodePNGColorMode *)&compressed);
      state->error = uVar5;
      if (uVar5 != 0) goto LAB_001ba564;
    }
    auto_color._24_8_ = auto_color._24_8_ & 0xffffffff00000000;
    bVar18 = CONCAT22(stats.key._2_2_,(undefined2)stats.key) == 0;
    bVar17 = 0x10 < stats.numpixels;
    uVar5 = 8;
    if (8 < stats.bits) {
      uVar5 = stats.bits;
    }
    if (bVar17 || bVar18) {
      uVar5 = stats.bits;
    }
    bVar19 = stats.colored == 0;
    bVar20 = stats.allow_greyscale != 0;
    uVar6 = 8;
    if (7 < uVar5) {
      uVar6 = uVar5;
    }
    if (bVar20 && bVar19) {
      uVar6 = uVar5;
    }
    if ((ulong)stats.numcolors < 3) {
      uVar5 = 1;
    }
    else if (stats.numcolors < 5) {
      uVar5 = 2;
    }
    else {
      uVar5 = (uint)(0x10 < stats.numcolors) * 4 + 4;
    }
    if (((stats.allow_palette == 0) ||
        (((bVar20 && bVar19) && ((bVar17 || bVar18) && stats.alpha == 0)) && uVar6 <= uVar5)) ||
       ((stats.numcolors - 0x101 < 0xffffff00 ||
        ((stats.numpixels < (ulong)stats.numcolors * 2 || (8 < uVar6)))))) {
      auto_color.colortype = (uint)(!bVar20 || !bVar19) * 2;
      if (!bVar17 && !bVar18 || stats.alpha != 0) {
        auto_color.colortype = (uint)(!bVar20 || !bVar19) * 2 + LCT_GREY_ALPHA;
      }
      if (CONCAT22(stats.key._2_2_,(undefined2)stats.key) != 0 && 0x10 < stats.numpixels) {
        uVar5 = ~(-1 << ((byte)uVar6 & 0x1f));
        auto_color.key_b = stats.key_b & uVar5;
        auto_color.key_g = stats.key_g & uVar5;
        auto_color.key_r = stats.key_r & uVar5;
        auto_color.key_defined = 1;
      }
      state->error = 0;
      auto_color.bitdepth = uVar6;
    }
    else {
      lodepng_palette_clear(&auto_color);
      uVar14 = 0;
      do {
        if (uVar14 == (ulong)stats._16_8_ >> 0x20) {
          uVar6 = 0;
          break;
        }
        uVar6 = lodepng_palette_add(&auto_color,stats.palette[uVar14 * 4],
                                    stats.palette[uVar14 * 4 + 1],stats.palette[uVar14 * 4 + 2],
                                    stats.palette[uVar14 * 4 + 3]);
        uVar14 = uVar14 + 1;
      } while (uVar6 == 0);
      auto_color.colortype = LCT_PALETTE;
      auto_color.bitdepth = uVar5;
      if (((mode_in->colortype == LCT_PALETTE) &&
          (auto_color.palettesize <= (state->info_raw).palettesize)) &&
         ((state->info_raw).bitdepth == uVar5)) {
        lodepng_palette_clear(&auto_color);
        lodepng_color_mode_copy(&auto_color,mode_in);
      }
      state->error = uVar6;
      if (uVar6 != 0) goto LAB_001ba564;
    }
    if ((state->info_png).sbit_defined == 0) {
      bVar17 = true;
    }
    else {
      uVar5 = (state->info_png).sbit_r;
      uVar6 = (state->info_png).sbit_g;
      uVar12 = uVar6;
      if (uVar6 < uVar5) {
        uVar12 = uVar5;
      }
      uVar2 = (state->info_png).sbit_b;
      uVar3 = (state->info_png).sbit_a;
      if (uVar12 <= uVar2) {
        uVar12 = uVar2;
      }
      if (uVar12 <= uVar3) {
        uVar12 = uVar3;
      }
      if ((uVar6 == 0 || uVar6 == uVar5) && (uVar2 == 0 || uVar2 == uVar5)) {
        bVar18 = uVar3 == uVar5 || uVar3 == 0;
      }
      else {
        bVar18 = false;
      }
      bVar17 = auto_color.colortype == LCT_PALETTE;
      bVar17 = ((info.color.colortype == LCT_RGB && bVar17) && uVar12 < 9 ||
               info.color.colortype == LCT_PALETTE && bVar17) ||
               (uVar3 == 8 && uVar12 < 9) && (info.color.colortype == LCT_RGBA && bVar17);
      if ((((info.color.colortype & ~LCT_GREY_ALPHA) == LCT_RGB) && (info.color.bitdepth == 0x10))
         && (uVar12 < 9)) {
        bVar17 = auto_color.bitdepth == 8 && auto_color.colortype == info.color.colortype || bVar17;
      }
      if (((bool)((auto_color.colortype != LCT_PALETTE && info.color.colortype != LCT_PALETTE) &
                 bVar18)) && (uVar5 == auto_color.bitdepth)) {
        bVar17 = true;
      }
    }
    if (((((state->encoder).force_palette == 0) ||
         ((info.color.colortype & ~LCT_GREY_ALPHA) == LCT_GREY)) ||
        ((auto_color.colortype & ~LCT_GREY_ALPHA) != LCT_GREY)) && (bVar17)) {
      lodepng_color_mode_copy(&info.color,&auto_color);
      if (((state->info_png).background_defined != 0) &&
         (uVar5 = lodepng_convert_rgb(&info.background_r,&info.background_g,&info.background_b,
                                      (state->info_png).background_r,(state->info_png).background_g,
                                      (state->info_png).background_b,&info.color,mode_in_00),
         uVar5 != 0)) {
        state->error = 0x68;
        goto LAB_001ba564;
      }
    }
  }
  if ((state->info_png).iccp_defined != 0) {
    puVar13 = (state->info_png).iccp_profile;
    uVar5 = (state->info_png).iccp_profile_size;
    uVar6 = isGrayICCProfile(puVar13,uVar5);
    uVar5 = isRGBICCProfile(puVar13,uVar5);
    if (uVar5 == 0 && uVar6 == 0) {
      state->error = 100;
      goto LAB_001ba564;
    }
    if (uVar6 == ((info.color.colortype & ~LCT_GREY_ALPHA) == LCT_GREY)) goto LAB_001babfc;
    uVar5 = 0x66 - ((state->encoder).auto_convert == 0);
    goto LAB_001bb0be;
  }
LAB_001babfc:
  settings = &state->encoder;
  iVar7 = lodepng_color_mode_equal(mode_in,&info.color);
  if (iVar7 == 0) {
    uVar5 = lodepng_get_bpp(&info.color);
    uVar14 = (ulong)uVar5 * (ulong)h * (ulong)w + 7;
    puVar13 = (uchar *)malloc(uVar14 >> 3);
    if (uVar14 < 8 || puVar13 != (uchar *)0x0) {
      if (state->error == 0) {
        uVar5 = lodepng_convert(puVar13,image,&info.color,mode_in,w,h);
        state->error = uVar5;
        if (uVar5 == 0) {
          uVar5 = preProcessScanlines(&data,&datasize,puVar13,w,h,&info,settings);
          state->error = uVar5;
          free(puVar13);
          goto joined_r0x001bb158;
        }
      }
    }
    else {
      state->error = 0x53;
    }
    free(puVar13);
    goto LAB_001ba564;
  }
  uVar5 = preProcessScanlines(&data,&datasize,image,w,h,&info,settings);
  state->error = uVar5;
joined_r0x001bb158:
  if (uVar5 != 0) goto LAB_001ba564;
  stats.colored = 0x474e5089;
  stats.key._0_2_ = 0xa0d;
  stats.key._2_2_ = 0xa1a;
  uVar5 = ucvector_resize(&v,8);
  if (uVar5 == 0) {
    state->error = 0x53;
    goto LAB_001ba564;
  }
  lodepng_memcpy(v.data,&stats,8);
  uVar6 = info.color.bitdepth;
  LVar1 = info.color.colortype;
  state->error = 0;
  uVar5 = lodepng_chunk_init((uchar **)&stats,&v,0xd,"IHDR");
  if (uVar5 != 0) goto LAB_001bb0be;
  puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
  puVar13[8] = (uchar)(w >> 0x18);
  puVar13[9] = (uchar)(w >> 0x10);
  puVar13[10] = (uchar)(w >> 8);
  puVar13[0xb] = (uchar)w;
  puVar13[0xc] = (uchar)(h >> 0x18);
  puVar13[0xd] = (uchar)(h >> 0x10);
  puVar13[0xe] = (uchar)(h >> 8);
  puVar13[0xf] = (uchar)h;
  puVar13[0x10] = (uchar)uVar6;
  puVar13[0x11] = (uchar)LVar1;
  puVar13[0x12] = '\0';
  puVar13[0x13] = '\0';
  puVar13[0x14] = (uchar)info.interlace_method;
  lodepng_chunk_generate_crc(puVar13);
  state->error = 0;
  if (info.unknown_chunks_data[0] != (uchar *)0x0) {
    uVar5 = addUnknownChunks(&v,info.unknown_chunks_data[0],info.unknown_chunks_size[0]);
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_001ba564;
  }
  if (info.cicp_defined != 0) {
    uVar5 = 0x74;
    if (((0xff < info.cicp_color_primaries) || (0xff < info.cicp_transfer_function)) ||
       ((0xff < info.cicp_matrix_coefficients ||
        ((0xff < info.cicp_video_full_range_flag ||
         (uVar5 = lodepng_chunk_init((uchar **)&stats,&v,4,"cICP"), uVar5 != 0))))))
    goto LAB_001bb0be;
    puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
    puVar13[8] = (uchar)info.cicp_color_primaries;
    puVar13[9] = (uchar)info.cicp_transfer_function;
    puVar13[10] = (uchar)info.cicp_matrix_coefficients;
    puVar13[0xb] = (uchar)info.cicp_video_full_range_flag;
    lodepng_chunk_generate_crc(puVar13);
    state->error = 0;
  }
  if (info.mdcv_defined != 0) {
    uVar5 = 0x76;
    if (((((0xffff < info.mdcv_red_x) || (0xffff < info.mdcv_red_y)) || (0xffff < info.mdcv_green_x)
         ) || ((0xffff < info.mdcv_green_y || (0xffff < info.mdcv_blue_x)))) ||
       (((0xffff < info.mdcv_blue_y ||
         ((0xffff < info.mdcv_white_x || (0xffff < info.mdcv_white_y)))) ||
        (uVar5 = lodepng_chunk_init((uchar **)&stats,&v,0x18,"mDCv"), uVar5 != 0))))
    goto LAB_001bb0be;
    puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
    puVar13[8] = info.mdcv_red_x._1_1_;
    puVar13[9] = (uchar)info.mdcv_red_x;
    puVar13[10] = info.mdcv_red_y._1_1_;
    puVar13[0xb] = (uchar)info.mdcv_red_y;
    puVar13[0xc] = info.mdcv_green_x._1_1_;
    puVar13[0xd] = (uchar)info.mdcv_green_x;
    puVar13[0xe] = info.mdcv_green_y._1_1_;
    puVar13[0xf] = (uchar)info.mdcv_green_y;
    puVar13[0x10] = info.mdcv_blue_x._1_1_;
    puVar13[0x11] = (uchar)info.mdcv_blue_x;
    puVar13[0x12] = info.mdcv_blue_y._1_1_;
    puVar13[0x13] = (uchar)info.mdcv_blue_y;
    puVar13[0x14] = info.mdcv_white_x._1_1_;
    puVar13[0x15] = (uchar)info.mdcv_white_x;
    puVar13[0x16] = info.mdcv_white_y._1_1_;
    puVar13[0x17] = (uchar)info.mdcv_white_y;
    *(uint *)(puVar13 + 0x18) =
         info.mdcv_max_luminance >> 0x18 | (info.mdcv_max_luminance & 0xff0000) >> 8 |
         (info.mdcv_max_luminance & 0xff00) << 8 | info.mdcv_max_luminance << 0x18;
    *(uint *)(puVar13 + 0x1c) =
         info.mdcv_min_luminance >> 0x18 | (info.mdcv_min_luminance & 0xff0000) >> 8 |
         (info.mdcv_min_luminance & 0xff00) << 8 | info.mdcv_min_luminance << 0x18;
    lodepng_chunk_generate_crc(puVar13);
    state->error = 0;
  }
  if (info.clli_defined != 0) {
    uVar5 = lodepng_chunk_init((uchar **)&stats,&v,8,"cLLi");
    if (uVar5 != 0) goto LAB_001bb0be;
    puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
    *(uint *)(puVar13 + 8) =
         info.clli_max_cll >> 0x18 | (info.clli_max_cll & 0xff0000) >> 8 |
         (info.clli_max_cll & 0xff00) << 8 | info.clli_max_cll << 0x18;
    *(uint *)(puVar13 + 0xc) =
         info.clli_max_fall >> 0x18 | (info.clli_max_fall & 0xff0000) >> 8 |
         (info.clli_max_fall & 0xff00) << 8 | info.clli_max_fall << 0x18;
    lodepng_chunk_generate_crc(puVar13);
    state->error = 0;
  }
  if (info.iccp_defined != 0) {
    stats.colored = 0;
    stats.key._0_2_ = 0;
    stats.key._2_2_ = 0;
    compressed = (uchar *)0x0;
    result.colortype = LCT_GREY;
    result.bitdepth = 0;
    sVar8 = lodepng_strlen(info.iccp_name);
    if (sVar8 - 0x50 < 0xffffffffffffffb1) {
LAB_001bb045:
      state->error = 0x59;
      goto LAB_001ba564;
    }
    uVar5 = zlib_compress(&compressed,(size_t *)&result,info.iccp_profile,
                          (ulong)info.iccp_profile_size,&settings->zlibsettings);
    if ((uVar5 == 0) &&
       (uVar5 = lodepng_chunk_init((uchar **)&stats,&v,sVar8 + result._0_8_ + 2,"iCCP"), uVar5 == 0)
       ) {
      puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
      lodepng_memcpy(puVar13 + 8,info.iccp_name,sVar8);
      (puVar13 + sVar8 + 8)[0] = '\0';
      (puVar13 + sVar8 + 8)[1] = '\0';
      lodepng_memcpy(puVar13 + sVar8 + 10,compressed,result._0_8_);
      lodepng_chunk_generate_crc(puVar13);
      uVar5 = 0;
    }
    free(compressed);
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_001ba564;
  }
  if (info.srgb_defined != 0) {
    stats.colored = CONCAT31(stats.colored._1_3_,(undefined1)info.srgb_intent);
    uVar5 = lodepng_chunk_createv(&v,1,"sRGB",(uchar *)&stats);
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_001ba564;
  }
  if (info.gama_defined != 0) {
    uVar5 = lodepng_chunk_init((uchar **)&stats,&v,4,"gAMA");
    if (uVar5 != 0) goto LAB_001bb0be;
    puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
    *(uint *)(puVar13 + 8) =
         info.gama_gamma >> 0x18 | (info.gama_gamma & 0xff0000) >> 8 |
         (info.gama_gamma & 0xff00) << 8 | info.gama_gamma << 0x18;
    lodepng_chunk_generate_crc(puVar13);
    state->error = 0;
  }
  if (info.chrm_defined != 0) {
    uVar5 = lodepng_chunk_init((uchar **)&stats,&v,0x20,"cHRM");
    if (uVar5 != 0) goto LAB_001bb0be;
    puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
    *(uint *)(puVar13 + 8) =
         info.chrm_white_x >> 0x18 | (info.chrm_white_x & 0xff0000) >> 8 |
         (info.chrm_white_x & 0xff00) << 8 | info.chrm_white_x << 0x18;
    *(uint *)(puVar13 + 0xc) =
         info.chrm_white_y >> 0x18 | (info.chrm_white_y & 0xff0000) >> 8 |
         (info.chrm_white_y & 0xff00) << 8 | info.chrm_white_y << 0x18;
    *(uint *)(puVar13 + 0x10) =
         info.chrm_red_x >> 0x18 | (info.chrm_red_x & 0xff0000) >> 8 |
         (info.chrm_red_x & 0xff00) << 8 | info.chrm_red_x << 0x18;
    *(uint *)(puVar13 + 0x14) =
         info.chrm_red_y >> 0x18 | (info.chrm_red_y & 0xff0000) >> 8 |
         (info.chrm_red_y & 0xff00) << 8 | info.chrm_red_y << 0x18;
    *(uint *)(puVar13 + 0x18) =
         info.chrm_green_x >> 0x18 | (info.chrm_green_x & 0xff0000) >> 8 |
         (info.chrm_green_x & 0xff00) << 8 | info.chrm_green_x << 0x18;
    *(uint *)(puVar13 + 0x1c) =
         info.chrm_green_y >> 0x18 | (info.chrm_green_y & 0xff0000) >> 8 |
         (info.chrm_green_y & 0xff00) << 8 | info.chrm_green_y << 0x18;
    *(uint *)(puVar13 + 0x20) =
         info.chrm_blue_x >> 0x18 | (info.chrm_blue_x & 0xff0000) >> 8 |
         (info.chrm_blue_x & 0xff00) << 8 | info.chrm_blue_x << 0x18;
    *(uint *)(puVar13 + 0x24) =
         info.chrm_blue_y >> 0x18 | (info.chrm_blue_y & 0xff0000) >> 8 |
         (info.chrm_blue_y & 0xff00) << 8 | info.chrm_blue_y << 0x18;
    lodepng_chunk_generate_crc(puVar13);
    state->error = 0;
  }
  if ((state->info_png).sbit_defined != 0) {
    uVar5 = 0x73;
    if (info.color.colortype == LCT_PALETTE) {
switchD_001bb44d_caseD_2:
      stats.key._2_2_ = 0;
      stats.key._0_2_ = 0;
      stats.colored = 0;
      if (((info.sbit_r != 0) && (info.sbit_g != 0)) &&
         ((info.sbit_b != 0 &&
          ((info.sbit_b <= local_714 && (info.sbit_g <= local_714 && info.sbit_r <= local_714) &&
           (uVar5 = lodepng_chunk_init((uchar **)&stats,&v,3,"sBIT"), uVar5 == 0)))))) {
        puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
        puVar13[8] = (uchar)info.sbit_r;
        puVar13[9] = (uchar)info.sbit_g;
        puVar13[10] = (uchar)info.sbit_b;
LAB_001bb5c8:
        lodepng_chunk_generate_crc(puVar13);
switchD_001bb44d_caseD_1:
        state->error = 0;
        goto LAB_001bb5d4;
      }
    }
    else {
      local_714 = info.color.bitdepth;
      stats.colored = 0;
      stats.key._0_2_ = 0;
      stats.key._2_2_ = 0;
      switch(info.color.colortype) {
      case LCT_GREY:
        if ((info.color.bitdepth <= info.sbit_r - 1) ||
           (uVar5 = lodepng_chunk_init((uchar **)&stats,&v,1,"sBIT"), uVar5 != 0)) break;
        puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
        puVar13[8] = (uchar)info.sbit_r;
        goto LAB_001bb5c8;
      default:
        goto switchD_001bb44d_caseD_1;
      case LCT_RGB:
        goto switchD_001bb44d_caseD_2;
      case LCT_GREY_ALPHA:
        if ((((info.sbit_r != 0) && (info.sbit_a != 0)) &&
            (info.sbit_a <= info.color.bitdepth && info.sbit_r <= info.color.bitdepth)) &&
           (uVar5 = lodepng_chunk_init((uchar **)&stats,&v,2,"sBIT"), uVar5 == 0)) {
          puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored))
          ;
          puVar13[8] = (uchar)info.sbit_r;
          puVar13[9] = (uchar)info.sbit_a;
          goto LAB_001bb5c8;
        }
        break;
      case LCT_RGBA:
        if ((((info.sbit_r != 0) && (info.sbit_g != 0)) && (info.sbit_b != 0)) &&
           (((info.sbit_r <= info.color.bitdepth && (info.sbit_g <= info.color.bitdepth)) &&
            ((info.sbit_b <= info.color.bitdepth &&
             ((info.sbit_a - 1 < info.color.bitdepth &&
              (uVar5 = lodepng_chunk_init((uchar **)&stats,&v,4,"sBIT"), uVar5 == 0)))))))) {
          puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored))
          ;
          puVar13[8] = (uchar)info.sbit_r;
          puVar13[9] = (uchar)info.sbit_g;
          puVar13[10] = (uchar)info.sbit_b;
          puVar13[0xb] = (uchar)info.sbit_a;
          goto LAB_001bb5c8;
        }
      }
    }
    goto LAB_001bb0be;
  }
LAB_001bb5d4:
  if (info.exif_defined != 0) {
    uVar5 = lodepng_chunk_createv(&v,(ulong)info.exif_size,"eXIf",info.exif);
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_001ba564;
  }
  if (info.color.colortype == LCT_PALETTE) {
    uVar5 = addChunk_PLTE(&v,&info.color);
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_001ba564;
  }
  if (((state->encoder).force_palette != 0) && ((info.color.colortype & ~LCT_GREY_ALPHA) == LCT_RGB)
     ) {
    uVar5 = addChunk_PLTE(&v,&info.color);
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_001ba564;
  }
  stats.colored = 0;
  stats.key._0_2_ = 0;
  stats.key._2_2_ = 0;
  if (info.color.colortype == LCT_GREY) {
    if (info.color.key_defined != 0) {
      uVar5 = lodepng_chunk_init((uchar **)&stats,&v,2,"tRNS");
      if (uVar5 != 0) goto LAB_001bb0be;
      puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
      puVar13[8] = info.color.key_r._1_1_;
      puVar13[9] = (uchar)info.color.key_r;
LAB_001bb7d1:
      lodepng_chunk_generate_crc(puVar13);
    }
  }
  else if (info.color.colortype == LCT_RGB) {
    if (info.color.key_defined != 0) {
      uVar5 = lodepng_chunk_init((uchar **)&stats,&v,6,"tRNS");
      if (uVar5 == 0) {
        puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
        puVar13[8] = info.color.key_r._1_1_;
        puVar13[9] = (uchar)info.color.key_r;
        puVar13[10] = info.color.key_g._1_1_;
        puVar13[0xb] = (uchar)info.color.key_g;
        puVar13[0xc] = info.color.key_b._1_1_;
        puVar13[0xd] = (uchar)info.color.key_b;
        goto LAB_001bb7d1;
      }
      goto LAB_001bb0be;
    }
  }
  else if (info.color.colortype == LCT_PALETTE) {
    do {
      sVar8 = info.color.palettesize;
      if (sVar8 == 0) goto LAB_001bb7d6;
      info.color.palettesize = sVar8 - 1;
    } while (info.color.palette[(sVar8 - 1) * 4 + 3] == 0xff);
    uVar5 = lodepng_chunk_init((uchar **)&stats,&v,sVar8,"tRNS");
    if (uVar5 != 0) goto LAB_001bb0be;
    puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
    for (sVar9 = 0; sVar8 != sVar9; sVar9 = sVar9 + 1) {
      puVar13[sVar9 + 8] = info.color.palette[sVar9 * 4 + 3];
    }
    if (puVar13 != (uchar *)0x0) goto LAB_001bb7d1;
  }
LAB_001bb7d6:
  state->error = 0;
  if (info.background_defined == 0) {
LAB_001bb906:
    if (info.phys_defined != 0) {
      uVar5 = lodepng_chunk_init((uchar **)&stats,&v,9,"pHYs");
      if (uVar5 != 0) goto LAB_001bb0be;
      puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
      *(uint *)(puVar13 + 8) =
           info.phys_x >> 0x18 | (info.phys_x & 0xff0000) >> 8 | (info.phys_x & 0xff00) << 8 |
           info.phys_x << 0x18;
      *(uint *)(puVar13 + 0xc) =
           info.phys_y >> 0x18 | (info.phys_y & 0xff0000) >> 8 | (info.phys_y & 0xff00) << 8 |
           info.phys_y << 0x18;
      puVar13[0x10] = (uchar)info.phys_unit;
      lodepng_chunk_generate_crc(puVar13);
      state->error = 0;
    }
    if (info.unknown_chunks_data[1] != (uchar *)0x0) {
      uVar5 = addUnknownChunks(&v,info.unknown_chunks_data[1],info.unknown_chunks_size[1]);
      state->error = uVar5;
      if (uVar5 != 0) goto LAB_001ba564;
    }
    stats.colored = 0;
    stats.key._0_2_ = 0;
    stats.key._2_2_ = 0;
    compressed = (uchar *)0x0;
    uVar5 = zlib_compress((uchar **)&stats,(size_t *)&compressed,data,datasize,
                          &settings->zlibsettings);
    lVar15 = 0;
    lVar16 = 0;
    while (uVar5 == 0) {
      puVar13 = (uchar *)(CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored)) +
                         lVar16);
      if ((ulong)(compressed + lVar15) >> 0x1f == 0) {
        uVar5 = lodepng_chunk_createv(&v,(size_t)(compressed + lVar15),"IDAT",puVar13);
        break;
      }
      uVar5 = lodepng_chunk_createv(&v,0x7fffffff,"IDAT",puVar13);
      lVar16 = lVar16 + 0x7fffffff;
      lVar15 = lVar15 + -0x7fffffff;
    }
    free((void *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored)));
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_001ba564;
    if (info.time_defined != 0) {
      uVar5 = lodepng_chunk_init((uchar **)&stats,&v,7,"tIME");
      if (uVar5 != 0) goto LAB_001bb0be;
      puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
      puVar13[8] = info.time.year._1_1_;
      puVar13[9] = (uchar)info.time.year;
      puVar13[10] = (uchar)info.time.month;
      puVar13[0xb] = (uchar)info.time.day;
      puVar13[0xc] = (uchar)info.time.hour;
      puVar13[0xd] = (uchar)info.time.minute;
      puVar13[0xe] = (uchar)info.time.second;
      lodepng_chunk_generate_crc(puVar13);
      state->error = 0;
    }
    for (sVar8 = 0; sVar8 != info.text_num; sVar8 = sVar8 + 1) {
      pcVar4 = info.text_keys[sVar8];
      sVar9 = lodepng_strlen(pcVar4);
      if (0x4f < sVar9) goto LAB_001bbef8;
      if (sVar9 == 0) goto LAB_001bbf07;
      puVar13 = (uchar *)info.text_strings[sVar8];
      if ((state->encoder).text_compression == 0) {
        uVar5 = addChunk_tEXt(&v,pcVar4,(char *)puVar13);
        state->error = uVar5;
      }
      else {
        stats.colored = 0;
        stats.key._0_2_ = 0;
        stats.key._2_2_ = 0;
        compressed = (uchar *)0x0;
        result.colortype = LCT_GREY;
        result.bitdepth = 0;
        sVar9 = lodepng_strlen(pcVar4);
        if (sVar9 - 0x50 < 0xffffffffffffffb1) goto LAB_001bb045;
        sVar10 = lodepng_strlen((char *)puVar13);
        uVar5 = zlib_compress(&compressed,(size_t *)&result,puVar13,sVar10,&settings->zlibsettings);
        if ((uVar5 == 0) &&
           (uVar5 = lodepng_chunk_init((uchar **)&stats,&v,result._0_8_ + sVar9 + 2,"zTXt"),
           uVar5 == 0)) {
          puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored))
          ;
          lodepng_memcpy(puVar13 + 8,pcVar4,sVar9);
          (puVar13 + sVar9 + 8)[0] = '\0';
          (puVar13 + sVar9 + 8)[1] = '\0';
          lodepng_memcpy(puVar13 + sVar9 + 10,compressed,result._0_8_);
          lodepng_chunk_generate_crc(puVar13);
          uVar5 = 0;
        }
        free(compressed);
        state->error = uVar5;
      }
      if (uVar5 != 0) goto LAB_001ba564;
    }
    if ((state->encoder).add_id != 0) {
      for (sVar9 = 0; sVar8 != sVar9; sVar9 = sVar9 + 1) {
        pcVar4 = info.text_keys[sVar9];
        if ((((*pcVar4 == 'L') && (pcVar4[1] == 'o')) && (pcVar4[2] == 'd')) &&
           (((pcVar4[3] == 'e' && (pcVar4[4] == 'P')) &&
            ((pcVar4[5] == 'N' && ((pcVar4[6] == 'G' && (pcVar4[7] == '\0'))))))))
        goto LAB_001bbcbe;
      }
      uVar5 = addChunk_tEXt(&v,"LodePNG",LODEPNG_VERSION_STRING);
      state->error = uVar5;
      if (uVar5 != 0) goto LAB_001ba564;
    }
LAB_001bbcbe:
    sVar8 = 0;
    do {
      if (sVar8 == info.itext_num) {
        if (info.unknown_chunks_data[2] != (uchar *)0x0) {
          uVar5 = addUnknownChunks(&v,info.unknown_chunks_data[2],info.unknown_chunks_size[2]);
          state->error = uVar5;
          if (uVar5 != 0) break;
        }
        uVar5 = lodepng_chunk_createv(&v,0,"IEND",(uchar *)0x0);
        goto LAB_001bb0be;
      }
      pcVar4 = info.itext_keys[sVar8];
      sVar9 = lodepng_strlen(pcVar4);
      if (0x4f < sVar9) goto LAB_001bbef8;
      if (sVar9 == 0) goto LAB_001bbf07;
      uVar5 = (state->encoder).text_compression;
      a = info.itext_langtags[sVar8];
      a_00 = info.itext_transkeys[sVar8];
      puVar13 = (uchar *)info.itext_strings[sVar8];
      stats.colored = 0;
      stats.key._0_2_ = 0;
      stats.key._2_2_ = 0;
      compressed = (uchar *)0x0;
      result.colortype = LCT_GREY;
      result.bitdepth = 0;
      sVar9 = lodepng_strlen((char *)puVar13);
      sVar10 = lodepng_strlen(pcVar4);
      size = lodepng_strlen(a);
      size_00 = lodepng_strlen(a_00);
      if (sVar10 - 0x50 < 0xffffffffffffffb1) goto LAB_001bb045;
      sVar11 = sVar9;
      if (((uVar5 == 0) ||
          (uVar6 = zlib_compress(&compressed,(size_t *)&result,puVar13,sVar9,&settings->zlibsettings
                                ), sVar11 = result._0_8_, uVar6 == 0)) &&
         (uVar6 = lodepng_chunk_init((uchar **)&stats,&v,sVar11 + size + sVar10 + size_00 + 5,"iTXt"
                                    ), uVar6 == 0)) {
        chunk = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
        lodepng_memcpy(chunk + 8,pcVar4,sVar10);
        chunk[sVar10 + 8] = '\0';
        chunk[sVar10 + 9] = uVar5 != 0;
        chunk[sVar10 + 10] = '\0';
        lodepng_memcpy(chunk + sVar10 + 0xb,a,size);
        lVar15 = size + sVar10 + 0xb;
        chunk[lVar15] = '\0';
        lodepng_memcpy(chunk + lVar15 + 1,a_00,size_00);
        chunk[size_00 + 1 + lVar15] = '\0';
        if (uVar5 != 0) {
          sVar9 = result._0_8_;
          puVar13 = compressed;
        }
        lodepng_memcpy(chunk + size_00 + lVar15 + 2,puVar13,sVar9);
        lodepng_chunk_generate_crc(chunk);
        uVar6 = 0;
      }
      free(compressed);
      state->error = uVar6;
      sVar8 = sVar8 + 1;
    } while (uVar6 == 0);
  }
  else {
    stats.colored = 0;
    stats.key._0_2_ = 0;
    stats.key._2_2_ = 0;
    switch(info.color.colortype) {
    case LCT_GREY:
    case LCT_GREY_ALPHA:
      uVar5 = lodepng_chunk_init((uchar **)&stats,&v,2,"bKGD");
      if (uVar5 == 0) {
        puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
        puVar13[8] = info.background_r._1_1_;
        puVar13[9] = (uchar)info.background_r;
LAB_001bb8fa:
        lodepng_chunk_generate_crc(puVar13);
        goto switchD_001bb813_caseD_1;
      }
      break;
    default:
switchD_001bb813_caseD_1:
      state->error = 0;
      goto LAB_001bb906;
    case LCT_RGB:
    case LCT_RGBA:
      uVar5 = lodepng_chunk_init((uchar **)&stats,&v,6,"bKGD");
      if (uVar5 == 0) {
        puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
        puVar13[8] = info.background_r._1_1_;
        puVar13[9] = (uchar)info.background_r;
        puVar13[10] = info.background_g._1_1_;
        puVar13[0xb] = (uchar)info.background_g;
        puVar13[0xc] = info.background_b._1_1_;
        puVar13[0xd] = (uchar)info.background_b;
        goto LAB_001bb8fa;
      }
      break;
    case LCT_PALETTE:
      uVar5 = lodepng_chunk_init((uchar **)&stats,&v,1,"bKGD");
      if (uVar5 == 0) {
        puVar13 = (uchar *)CONCAT26(stats.key._2_2_,CONCAT24((undefined2)stats.key,stats.colored));
        puVar13[8] = (uchar)info.background_r;
        goto LAB_001bb8fa;
      }
    }
LAB_001bb0be:
    state->error = uVar5;
  }
LAB_001ba564:
  lodepng_info_cleanup(&info);
  free(data);
  lodepng_palette_clear(&auto_color);
  *out = v.data;
  *outsize = v.size;
  return state->error;
LAB_001bbef8:
  state->error = 0x42;
  goto LAB_001ba564;
LAB_001bbf07:
  state->error = 0x43;
  goto LAB_001ba564;
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state) {
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;
  ucvector outv = ucvector_init(NULL, 0);
  LodePNGInfo info;
  const LodePNGInfo* info_png = &state->info_png;
  LodePNGColorMode auto_color;

  lodepng_info_init(&info);
  lodepng_color_mode_init(&auto_color);

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  /*check input values validity*/
  if((info_png->color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (info_png->color.palettesize == 0 || info_png->color.palettesize > 256)) {
    /*this error is returned even if auto_convert is enabled and thus encoder could
    generate the palette by itself: while allowing this could be possible in theory,
    it may complicate the code or edge cases, and always requiring to give a palette
    when setting this color type is a simpler contract*/
    state->error = 68; /*invalid palette size, it is only allowed to be 1-256*/
    goto cleanup;
  }
  if(state->encoder.zlibsettings.btype > 2) {
    state->error = 61; /*error: invalid btype*/
    goto cleanup;
  }
  if(info_png->interlace_method > 1) {
    state->error = 71; /*error: invalid interlace mode*/
    goto cleanup;
  }
  state->error = checkColorValidity(info_png->color.colortype, info_png->color.bitdepth);
  if(state->error) goto cleanup; /*error: invalid color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) goto cleanup; /*error: invalid color type given*/

  /* color convert and compute scanline filter types */
  lodepng_info_copy(&info, &state->info_png);
  if(state->encoder.auto_convert) {
    LodePNGColorStats stats;
    unsigned allow_convert = 1;
    lodepng_color_stats_init(&stats);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    if(info_png->iccp_defined &&
        isGrayICCProfile(info_png->iccp_profile, info_png->iccp_profile_size)) {
      /*the PNG specification does not allow to use palette with a GRAY ICC profile, even
      if the palette has only gray colors, so disallow it.*/
      stats.allow_palette = 0;
    }
    if(info_png->iccp_defined &&
        isRGBICCProfile(info_png->iccp_profile, info_png->iccp_profile_size)) {
      /*the PNG specification does not allow to use grayscale color with RGB ICC profile, so disallow gray.*/
      stats.allow_greyscale = 0;
    }
#endif /* LODEPNG_COMPILE_ANCILLARY_CHUNKS */
    state->error = lodepng_compute_color_stats(&stats, image, w, h, &state->info_raw);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    if(info_png->background_defined) {
      /*the background chunk's color must be taken into account as well*/
      unsigned r = 0, g = 0, b = 0;
      LodePNGColorMode mode16 = lodepng_color_mode_make(LCT_RGB, 16);
      lodepng_convert_rgb(&r, &g, &b,
          info_png->background_r, info_png->background_g, info_png->background_b, &mode16, &info_png->color);
      state->error = lodepng_color_stats_add(&stats, r, g, b, 65535);
      if(state->error) goto cleanup;
    }
#endif /* LODEPNG_COMPILE_ANCILLARY_CHUNKS */
    state->error = auto_choose_color(&auto_color, &state->info_raw, &stats);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    if(info_png->sbit_defined) {
      /*if sbit is defined, due to strict requirements of which sbit values can be present for which color modes,
      auto_convert can't be done in many cases. However, do support a few cases here.
      TODO: more conversions may be possible, and it may also be possible to get a more appropriate color type out of
            auto_choose_color if knowledge about sbit is used beforehand
      */
      unsigned sbit_max = LODEPNG_MAX(LODEPNG_MAX(LODEPNG_MAX(info_png->sbit_r, info_png->sbit_g),
                           info_png->sbit_b), info_png->sbit_a);
      unsigned equal = (!info_png->sbit_g || info_png->sbit_g == info_png->sbit_r)
                    && (!info_png->sbit_b || info_png->sbit_b == info_png->sbit_r)
                    && (!info_png->sbit_a || info_png->sbit_a == info_png->sbit_r);
      allow_convert = 0;
      if(info.color.colortype == LCT_PALETTE &&
         auto_color.colortype == LCT_PALETTE) {
        /* input and output are palette, and in this case it may happen that palette data is
        expected to be copied from info_raw into the info_png */
        allow_convert = 1;
      }
      /*going from 8-bit RGB to palette (or 16-bit as long as sbit_max <= 8) is possible
      since both are 8-bit RGB for sBIT's purposes*/
      if(info.color.colortype == LCT_RGB &&
         auto_color.colortype == LCT_PALETTE && sbit_max <= 8) {
        allow_convert = 1;
      }
      /*going from 8-bit RGBA to palette is also ok but only if sbit_a is exactly 8*/
      if(info.color.colortype == LCT_RGBA && auto_color.colortype == LCT_PALETTE &&
         info_png->sbit_a == 8 && sbit_max <= 8) {
        allow_convert = 1;
      }
      /*going from 16-bit RGB(A) to 8-bit RGB(A) is ok if all sbit values are <= 8*/
      if((info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA) && info.color.bitdepth == 16 &&
         auto_color.colortype == info.color.colortype && auto_color.bitdepth == 8 &&
         sbit_max <= 8) {
        allow_convert = 1;
      }
      /*going to less channels is ok if all bit values are equal (all possible values in sbit,
        as well as the chosen bitdepth of the result). Due to how auto_convert works,
        we already know that auto_color.colortype has less than or equal amount of channels than
        info.colortype. Palette is not used here. This conversion is not allowed if
        info_png->sbit_r < auto_color.bitdepth, because specifically for alpha, non-presence of
        an sbit value heavily implies that alpha's bit depth is equal to the PNG bit depth (rather
        than the bit depths set in the r, g and b sbit values, by how the PNG specification describes
        handling tRNS chunk case with sBIT), so be conservative here about ignoring user input.*/
      if(info.color.colortype != LCT_PALETTE && auto_color.colortype != LCT_PALETTE &&
         equal && info_png->sbit_r == auto_color.bitdepth) {
        allow_convert = 1;
      }
    }
#endif
    if(state->encoder.force_palette) {
      if(info.color.colortype != LCT_GREY && info.color.colortype != LCT_GREY_ALPHA &&
         (auto_color.colortype == LCT_GREY || auto_color.colortype == LCT_GREY_ALPHA)) {
        /*user speficially forced a PLTE palette, so cannot convert to grayscale types because
        the PNG specification only allows writing a suggested palette in PLTE for truecolor types*/
        allow_convert = 0;
      }
    }
    if(allow_convert) {
      lodepng_color_mode_copy(&info.color, &auto_color);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      /*also convert the background chunk*/
      if(info_png->background_defined) {
        if(lodepng_convert_rgb(&info.background_r, &info.background_g, &info.background_b,
            info_png->background_r, info_png->background_g, info_png->background_b, &info.color, &info_png->color)) {
          state->error = 104;
          goto cleanup;
        }
      }
#endif /* LODEPNG_COMPILE_ANCILLARY_CHUNKS */
    }
  }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  if(info_png->iccp_defined) {
    unsigned gray_icc = isGrayICCProfile(info_png->iccp_profile, info_png->iccp_profile_size);
    unsigned rgb_icc = isRGBICCProfile(info_png->iccp_profile, info_png->iccp_profile_size);
    unsigned gray_png = info.color.colortype == LCT_GREY || info.color.colortype == LCT_GREY_ALPHA;
    if(!gray_icc && !rgb_icc) {
      state->error = 100; /* Disallowed profile color type for PNG */
      goto cleanup;
    }
    if(gray_icc != gray_png) {
      /*Not allowed to use RGB/RGBA/palette with GRAY ICC profile or vice versa,
      or in case of auto_convert, it wasn't possible to find appropriate model*/
      state->error = state->encoder.auto_convert ? 102 : 101;
      goto cleanup;
    }
  }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  if(!lodepng_color_mode_equal(&state->info_raw, &info.color)) {
    unsigned char* converted;
    size_t size = ((size_t)w * (size_t)h * (size_t)lodepng_get_bpp(&info.color) + 7u) / 8u;

    converted = (unsigned char*)lodepng_malloc(size);
    if(!converted && size) state->error = 83; /*alloc fail*/
    if(!state->error) {
      state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
    }
    if(!state->error) {
      state->error = preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
    }
    lodepng_free(converted);
    if(state->error) goto cleanup;
  } else {
    state->error = preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);
    if(state->error) goto cleanup;
  }

  /* output all PNG chunks */ {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    state->error = writeSignature(&outv);
    if(state->error) goto cleanup;
    /*IHDR*/
    state->error = addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0]) {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) goto cleanup;
    }
    /*color profile chunks must come before PLTE */
    if(info.cicp_defined) {
      state->error = addChunk_cICP(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.mdcv_defined) {
      state->error = addChunk_mDCv(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.clli_defined) {
      state->error = addChunk_cLLi(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.iccp_defined) {
      state->error = addChunk_iCCP(&outv, &info, &state->encoder.zlibsettings);
      if(state->error) goto cleanup;
    }
    if(info.srgb_defined) {
      state->error = addChunk_sRGB(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.gama_defined) {
      state->error = addChunk_gAMA(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.chrm_defined) {
      state->error = addChunk_cHRM(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info_png->sbit_defined) {
      state->error = addChunk_sBIT(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.exif_defined) {
      state->error = addChunk_eXIf(&outv, &info);
      if(state->error) goto cleanup;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE) {
      state->error = addChunk_PLTE(&outv, &info.color);
      if(state->error) goto cleanup;
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA)) {
      /*force_palette means: write suggested palette for truecolor in PLTE chunk*/
      state->error = addChunk_PLTE(&outv, &info.color);
      if(state->error) goto cleanup;
    }
    /*tRNS (this will only add if when necessary) */
    state->error = addChunk_tRNS(&outv, &info.color);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) {
      state->error = addChunk_bKGD(&outv, &info);
      if(state->error) goto cleanup;
    }
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) {
      state->error = addChunk_pHYs(&outv, &info);
      if(state->error) goto cleanup;
    }

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1]) {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) goto cleanup;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) {
      state->error = addChunk_tIME(&outv, &info.time);
      if(state->error) goto cleanup;
    }
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i) {
      if(lodepng_strlen(info.text_keys[i]) > 79) {
        state->error = 66; /*text chunk too large*/
        goto cleanup;
      }
      if(lodepng_strlen(info.text_keys[i]) < 1) {
        state->error = 67; /*text chunk too small*/
        goto cleanup;
      }
      if(state->encoder.text_compression) {
        state->error = addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
        if(state->error) goto cleanup;
      } else {
        state->error = addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
        if(state->error) goto cleanup;
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id) {
      unsigned already_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i) {
        const char* k = info.text_keys[i];
        /* Could use strcmp, but we're not calling or reimplementing this C library function for this use only */
        if(k[0] == 'L' && k[1] == 'o' && k[2] == 'd' && k[3] == 'e' &&
           k[4] == 'P' && k[5] == 'N' && k[6] == 'G' && k[7] == '\0') {
          already_added_id_text = 1;
          break;
        }
      }
      if(already_added_id_text == 0) {
        state->error = addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
        if(state->error) goto cleanup;
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i) {
      if(lodepng_strlen(info.itext_keys[i]) > 79) {
        state->error = 66; /*text chunk too large*/
        goto cleanup;
      }
      if(lodepng_strlen(info.itext_keys[i]) < 1) {
        state->error = 67; /*text chunk too small*/
        goto cleanup;
      }
      state->error = addChunk_iTXt(
          &outv, state->encoder.text_compression,
          info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
          &state->encoder.zlibsettings);
      if(state->error) goto cleanup;
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2]) {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) goto cleanup;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    state->error = addChunk_IEND(&outv);
    if(state->error) goto cleanup;
  }

cleanup:
  lodepng_info_cleanup(&info);
  lodepng_free(data);
  lodepng_color_mode_cleanup(&auto_color);

  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}